

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo::MergeFrom(GeneratedCodeInfo *this,GeneratedCodeInfo *from)

{
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *this_00;
  long in_RSI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff28;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_stack_ffffffffffffff30;
  
  this_00 = (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
             *)(in_RSI + 8);
  if (((uint)*(undefined8 *)this_00 & 1) == 1) {
    if (((uint)*(undefined8 *)this_00 & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                (this_00);
      in_stack_ffffffffffffff30 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff30 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  }
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::MergeFrom
            ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
             in_stack_ffffffffffffff30,
             (RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)
             in_stack_ffffffffffffff28);
  return;
}

Assistant:

void GeneratedCodeInfo::MergeFrom(const GeneratedCodeInfo& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  annotation_.MergeFrom(from.annotation_);
}